

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadSubdivMesh(XMLLoader *this,Ref<embree::XML> *xml)

{
  XML *pXVar1;
  string *psVar2;
  XML *this_00;
  void *pvVar3;
  _Alloc_hider this_01;
  bool bVar4;
  RTCSubdivisionMode RVar5;
  SubdivMeshNode *this_02;
  _Alloc_hider in_RCX;
  undefined8 *in_RDX;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *extraout_RDX_01;
  uchar *extraout_RDX_02;
  uchar *extraout_RDX_03;
  uchar *sig;
  ulong uVar6;
  uchar *in_R8;
  size_t in_R9;
  vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
  *pvVar7;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *this_03;
  Ref<embree::XML> animation;
  Ref<embree::XML> animation_1;
  Ref<embree::SceneGraph::MaterialNode> material;
  Ref<embree::XML> local_b0;
  string local_a8;
  undefined1 local_88 [40];
  undefined8 *local_60;
  _Alloc_hider local_58;
  undefined1 local_50 [24];
  XMLLoader *local_38;
  
  psVar2 = (string *)*in_RDX;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_60 = in_RDX;
  local_38 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"material","");
  XML::child((XML *)local_88,psVar2);
  loadMaterial((XMLLoader *)(local_50 + 0x10),xml);
  if ((XML *)local_88._0_8_ != (XML *)0x0) {
    (**(code **)((long)*(anon_union_8_2_4062524c_for_Vec2<float>_1 *)local_88._0_8_ + 0x18))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  this_02 = (SubdivMeshNode *)operator_new(0x1b0);
  local_50._8_8_ = local_50._16_8_;
  local_58._M_p = (pointer)this_02;
  if ((long *)local_50._16_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_50._16_8_ + 0x10))();
  }
  SceneGraph::SubdivMeshNode::SubdivMeshNode
            (this_02,(Ref<embree::SceneGraph::MaterialNode> *)(local_50 + 8),
             (BBox1f)0x3f80000000000000,0);
  (*(this_02->super_Node).super_RefCount._vptr_RefCount[2])(this_02);
  if ((long *)local_50._8_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_50._8_8_ + 0x18))();
  }
  psVar2 = (string *)*local_60;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"animated_positions","");
  XML::childOpt((XML *)&local_b0,psVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if (local_b0.ptr == (XML *)0x0) {
    psVar2 = (string *)*local_60;
    pXVar1 = (XML *)(local_88 + 0x10);
    local_88._0_8_ = pXVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"positions","");
    XML::childOpt((XML *)(local_88 + 0x38),psVar2);
    loadVec3faArray((avector<Vec3fa> *)&local_a8,(XMLLoader *)xml,
                    (Ref<embree::XML> *)(local_88 + 0x38));
    pvVar7 = (vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
              *)(local_58._M_p + 0x70);
    std::
    vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
    ::emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
              (pvVar7,(vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                      &local_a8);
    alignedFree((void *)local_a8.field_2._8_8_);
    local_a8._M_string_length = 0;
    local_a8.field_2._M_allocated_capacity = 0;
    local_a8.field_2._8_8_ = (void *)0x0;
    if ((_Base_ptr)local_50._0_8_ != (_Base_ptr)0x0) {
      (**(code **)(*(long *)(_Rb_tree_color *)local_50._0_8_ + 0x18))();
    }
    if ((XML *)local_88._0_8_ != pXVar1) {
      operator_delete((void *)local_88._0_8_);
    }
    this_00 = (XML *)*local_60;
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"positions2","");
    bVar4 = XML::hasChild(this_00,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if (bVar4) {
      psVar2 = (string *)*local_60;
      local_88._0_8_ = pXVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"positions2","");
      XML::childOpt((XML *)(local_88 + 0x38),psVar2);
      loadVec3faArray((avector<Vec3fa> *)&local_a8,(XMLLoader *)xml,
                      (Ref<embree::XML> *)(local_88 + 0x38));
      std::
      vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                (pvVar7,(vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>
                         *)&local_a8);
      alignedFree((void *)local_a8.field_2._8_8_);
      local_a8._M_string_length = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      local_a8.field_2._8_8_ = (void *)0x0;
      if ((_Base_ptr)local_50._0_8_ != (_Base_ptr)0x0) {
        (**(code **)(*(long *)(_Rb_tree_color *)local_50._0_8_ + 0x18))();
      }
      if ((XML *)local_88._0_8_ != pXVar1) {
        operator_delete((void *)local_88._0_8_);
      }
    }
  }
  else if (((local_b0.ptr)->children).
           super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>.
           _M_impl.super__Vector_impl_data._M_finish !=
           ((local_b0.ptr)->children).
           super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>.
           _M_impl.super__Vector_impl_data._M_start) {
    pvVar7 = (vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
              *)(local_58._M_p + 0x70);
    uVar6 = 0;
    do {
      XML::child((XML *)local_88,(size_t)local_b0.ptr);
      loadVec3faArray((avector<Vec3fa> *)&local_a8,(XMLLoader *)xml,(Ref<embree::XML> *)local_88);
      std::
      vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                (pvVar7,(vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>
                         *)&local_a8);
      alignedFree((void *)local_a8.field_2._8_8_);
      local_a8._M_string_length = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      local_a8.field_2._8_8_ = (void *)0x0;
      if ((XML *)local_88._0_8_ != (XML *)0x0) {
        (**(code **)((long)*(anon_union_8_2_4062524c_for_Vec2<float>_1 *)local_88._0_8_ + 0x18))();
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)((long)((local_b0.ptr)->children).
                                   super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)((local_b0.ptr)->children).
                                   super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (local_b0.ptr != (XML *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  psVar2 = (string *)*local_60;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"animated_normals","");
  XML::childOpt((XML *)local_88,psVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((XML *)local_88._0_8_ == (XML *)0x0) {
    psVar2 = (string *)*local_60;
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"normals","");
    XML::childOpt((XML *)&local_b0,psVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if (local_b0.ptr != (XML *)0x0) {
      loadVec3faArray((avector<Vec3fa> *)&local_a8,(XMLLoader *)xml,&local_b0);
      if (((element_type *)local_a8._M_string_length != (element_type *)0x0) &&
         (in_RCX._M_p = local_58._M_p,
         *(pointer *)(local_58._M_p + 0x78) !=
         (((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            *)(local_58._M_p + 0x70))->
         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start)) {
        this_03 = (vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                   *)(local_58._M_p + 0x88);
        uVar6 = 0;
        do {
          std::
          vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
          ::push_back(this_03,(value_type *)&local_a8);
          uVar6 = uVar6 + 1;
          in_RCX._M_p = local_58._M_p;
        } while (uVar6 < (ulong)((long)*(pointer *)(local_58._M_p + 0x78) -
                                 (long)(((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                          *)(local_58._M_p + 0x70))->
                                       super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      alignedFree((void *)local_a8.field_2._8_8_);
      local_a8._M_string_length = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      local_a8.field_2._8_8_ = (void *)0x0;
    }
    if (local_b0.ptr != (XML *)0x0) {
      (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
  }
  else if ((((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
            (local_88._0_8_ + 0x80))->
           super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>)
           ._M_impl.super__Vector_impl_data._M_finish !=
           (((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
            (local_88._0_8_ + 0x80))->
           super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>)
           ._M_impl.super__Vector_impl_data._M_start) {
    pvVar7 = (vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
              *)(local_58._M_p + 0x88);
    uVar6 = 0;
    do {
      XML::child((XML *)&local_b0,local_88._0_8_);
      loadVec3faArray((avector<Vec3fa> *)&local_a8,(XMLLoader *)xml,&local_b0);
      std::
      vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                (pvVar7,(vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>
                         *)&local_a8);
      alignedFree((void *)local_a8.field_2._8_8_);
      local_a8._M_string_length = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      local_a8.field_2._8_8_ = (void *)0x0;
      if (local_b0.ptr != (XML *)0x0) {
        (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)((long)(((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                      *)(local_88._0_8_ + 0x80))->
                                   super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                      *)(local_88._0_8_ + 0x80))->
                                   super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if ((XML *)local_88._0_8_ != (XML *)0x0) {
    (**(code **)((long)*(anon_union_8_2_4062524c_for_Vec2<float>_1 *)local_88._0_8_ + 0x18))();
  }
  this_01._M_p = local_58._M_p;
  psVar2 = (string *)*local_60;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"texcoords","");
  XML::childOpt((XML *)&local_b0,psVar2);
  loadVec2fArray((vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)local_88,
                 (XMLLoader *)xml,&local_b0);
  pvVar3 = (((vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)
            (this_01._M_p + 0xa0))->
           super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  (((vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)(this_01._M_p + 0xa0))->
  super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>)._M_impl.
  super__Vector_impl_data._M_start = local_88._0_8_;
  *(undefined8 *)(this_01._M_p + 0xa8) = local_88._8_8_;
  *(undefined8 *)(this_01._M_p + 0xb0) = local_88._16_8_;
  local_88._0_8_ = (XML *)0x0;
  local_88._8_8_ = 0;
  local_88._16_8_ = (element_type *)0x0;
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3);
  }
  if ((XML *)local_88._0_8_ != (XML *)0x0) {
    operator_delete((void *)local_88._0_8_);
  }
  if (local_b0.ptr != (XML *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  psVar2 = (string *)*local_60;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"position_indices","");
  XML::childOpt((XML *)local_88,psVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((XML *)local_88._0_8_ != (XML *)0x0) {
    loadUIntArray((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,(XMLLoader *)xml,
                  (Ref<embree::XML> *)local_88);
    pvVar3 = (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(this_01._M_p + 0xb8))->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    *(pointer *)
     &(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(this_01._M_p + 0xb8))->
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data = local_a8._M_dataplus._M_p;
    *(size_type *)(this_01._M_p + 0xc0) = local_a8._M_string_length;
    *(size_type *)(this_01._M_p + 200) = local_a8.field_2._M_allocated_capacity;
    local_a8._M_dataplus._M_p = (pointer)0x0;
    local_a8._M_string_length = 0;
    local_a8.field_2._M_allocated_capacity = 0;
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    RVar5 = parseSubdivMode((Ref<embree::XML> *)local_88);
    *(RTCSubdivisionMode *)(this_01._M_p + 0x100) = RVar5;
  }
  if ((XML *)local_88._0_8_ != (XML *)0x0) {
    (**(code **)((long)*(anon_union_8_2_4062524c_for_Vec2<float>_1 *)local_88._0_8_ + 0x18))();
  }
  psVar2 = (string *)*local_60;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"normal_indices","");
  XML::childOpt((XML *)local_88,psVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((XML *)local_88._0_8_ != (XML *)0x0) {
    loadUIntArray((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,(XMLLoader *)xml,
                  (Ref<embree::XML> *)local_88);
    pvVar3 = (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(this_01._M_p + 0xd0))->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    *(pointer *)
     &(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(this_01._M_p + 0xd0))->
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data = local_a8._M_dataplus._M_p;
    *(size_type *)(this_01._M_p + 0xd8) = local_a8._M_string_length;
    *(size_type *)(this_01._M_p + 0xe0) = local_a8.field_2._M_allocated_capacity;
    local_a8._M_dataplus._M_p = (pointer)0x0;
    local_a8._M_string_length = 0;
    local_a8.field_2._M_allocated_capacity = 0;
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    RVar5 = parseSubdivMode((Ref<embree::XML> *)local_88);
    *(RTCSubdivisionMode *)(this_01._M_p + 0x104) = RVar5;
  }
  if ((XML *)local_88._0_8_ != (XML *)0x0) {
    (**(code **)((long)*(anon_union_8_2_4062524c_for_Vec2<float>_1 *)local_88._0_8_ + 0x18))();
  }
  psVar2 = (string *)*local_60;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"texcoord_indices","");
  XML::childOpt((XML *)local_88,psVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((XML *)local_88._0_8_ != (XML *)0x0) {
    loadUIntArray((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,(XMLLoader *)xml,
                  (Ref<embree::XML> *)local_88);
    pvVar3 = (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(this_01._M_p + 0xe8))->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    *(pointer *)
     &(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(this_01._M_p + 0xe8))->
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data = local_a8._M_dataplus._M_p;
    *(size_type *)(this_01._M_p + 0xf0) = local_a8._M_string_length;
    *(size_type *)(this_01._M_p + 0xf8) = local_a8.field_2._M_allocated_capacity;
    local_a8._M_dataplus._M_p = (pointer)0x0;
    local_a8._M_string_length = 0;
    local_a8.field_2._M_allocated_capacity = 0;
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    RVar5 = parseSubdivMode((Ref<embree::XML> *)local_88);
    *(RTCSubdivisionMode *)(this_01._M_p + 0x108) = RVar5;
  }
  if ((XML *)local_88._0_8_ != (XML *)0x0) {
    (**(code **)((long)*(anon_union_8_2_4062524c_for_Vec2<float>_1 *)local_88._0_8_ + 0x18))();
  }
  psVar2 = (string *)*local_60;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"faces","");
  XML::childOpt((XML *)&local_b0,psVar2);
  loadUIntArray((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88,(XMLLoader *)xml,
                &local_b0);
  pvVar3 = (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(this_01._M_p + 0x110))->
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(this_01._M_p + 0x110))->
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.super__Vector_impl_data.
  _M_start = local_88._0_8_;
  *(undefined8 *)(this_01._M_p + 0x118) = local_88._8_8_;
  *(undefined8 *)(this_01._M_p + 0x120) = local_88._16_8_;
  local_88._0_8_ = (XML *)0x0;
  local_88._8_8_ = 0;
  local_88._16_8_ = (element_type *)0x0;
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3);
  }
  if ((XML *)local_88._0_8_ != (XML *)0x0) {
    operator_delete((void *)local_88._0_8_);
  }
  if (local_b0.ptr != (XML *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  psVar2 = (string *)*local_60;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"holes","");
  XML::childOpt((XML *)&local_b0,psVar2);
  loadUIntArray((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88,(XMLLoader *)xml,
                &local_b0);
  pvVar3 = (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(this_01._M_p + 0x128))->
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(this_01._M_p + 0x128))->
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.super__Vector_impl_data.
  _M_start = local_88._0_8_;
  *(undefined8 *)(this_01._M_p + 0x130) = local_88._8_8_;
  *(undefined8 *)(this_01._M_p + 0x138) = local_88._16_8_;
  local_88._0_8_ = (XML *)0x0;
  local_88._8_8_ = 0;
  local_88._16_8_ = (element_type *)0x0;
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3);
  }
  if ((XML *)local_88._0_8_ != (XML *)0x0) {
    operator_delete((void *)local_88._0_8_);
  }
  if (local_b0.ptr != (XML *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  psVar2 = (string *)*local_60;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"edge_creases","");
  XML::childOpt((XML *)&local_b0,psVar2);
  loadVec2iArray((vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> *)local_88,
                 (XMLLoader *)xml,&local_b0);
  pvVar3 = (((vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> *)
            (this_01._M_p + 0x140))->
           super__Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  (((vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> *)(this_01._M_p + 0x140))->
  super__Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>)._M_impl.
  super__Vector_impl_data._M_start = local_88._0_8_;
  *(undefined8 *)(this_01._M_p + 0x148) = local_88._8_8_;
  *(undefined8 *)(this_01._M_p + 0x150) = local_88._16_8_;
  local_88._0_8_ = (XML *)0x0;
  local_88._8_8_ = 0;
  local_88._16_8_ = (element_type *)0x0;
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3);
  }
  if ((XML *)local_88._0_8_ != (XML *)0x0) {
    operator_delete((void *)local_88._0_8_);
  }
  if (local_b0.ptr != (XML *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  psVar2 = (string *)*local_60;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"edge_crease_weights","");
  XML::childOpt((XML *)&local_b0,psVar2);
  loadFloatArray((vector<float,_std::allocator<float>_> *)local_88,(XMLLoader *)xml,&local_b0);
  pvVar3 = (((vector<float,_std::allocator<float>_> *)(this_01._M_p + 0x158))->
           super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  (((vector<float,_std::allocator<float>_> *)(this_01._M_p + 0x158))->
  super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data._M_start =
       local_88._0_8_;
  *(undefined8 *)(this_01._M_p + 0x160) = local_88._8_8_;
  *(undefined8 *)(this_01._M_p + 0x168) = local_88._16_8_;
  local_88._0_8_ = (XML *)0x0;
  local_88._8_8_ = 0;
  local_88._16_8_ = (element_type *)0x0;
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3);
  }
  if ((XML *)local_88._0_8_ != (XML *)0x0) {
    operator_delete((void *)local_88._0_8_);
  }
  if (local_b0.ptr != (XML *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  psVar2 = (string *)*local_60;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"vertex_creases","");
  XML::childOpt((XML *)&local_b0,psVar2);
  loadUIntArray((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88,(XMLLoader *)xml,
                &local_b0);
  pvVar3 = (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(this_01._M_p + 0x170))->
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(this_01._M_p + 0x170))->
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.super__Vector_impl_data.
  _M_start = local_88._0_8_;
  *(undefined8 *)(this_01._M_p + 0x178) = local_88._8_8_;
  *(undefined8 *)(this_01._M_p + 0x180) = local_88._16_8_;
  local_88._0_8_ = (XML *)0x0;
  local_88._8_8_ = 0;
  local_88._16_8_ = (element_type *)0x0;
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3);
  }
  if ((XML *)local_88._0_8_ != (XML *)0x0) {
    operator_delete((void *)local_88._0_8_);
  }
  if (local_b0.ptr != (XML *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  psVar2 = (string *)*local_60;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"vertex_crease_weights","");
  XML::childOpt((XML *)&local_b0,psVar2);
  loadFloatArray((vector<float,_std::allocator<float>_> *)local_88,(XMLLoader *)xml,&local_b0);
  pvVar3 = (((vector<float,_std::allocator<float>_> *)(this_01._M_p + 0x188))->
           super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  (((vector<float,_std::allocator<float>_> *)(this_01._M_p + 0x188))->
  super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data._M_start =
       local_88._0_8_;
  *(undefined8 *)(this_01._M_p + 400) = local_88._8_8_;
  *(undefined8 *)(this_01._M_p + 0x198) = local_88._16_8_;
  local_88._0_8_ = (XML *)0x0;
  local_88._8_8_ = 0;
  local_88._16_8_ = (element_type *)0x0;
  sig = extraout_RDX;
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3);
    sig = extraout_RDX_00;
  }
  if ((XML *)local_88._0_8_ != (XML *)0x0) {
    operator_delete((void *)local_88._0_8_);
    sig = extraout_RDX_01;
  }
  if (local_b0.ptr != (XML *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
    sig = extraout_RDX_02;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
    sig = extraout_RDX_03;
  }
  SceneGraph::SubdivMeshNode::verify
            ((SubdivMeshNode *)this_01._M_p,(EVP_PKEY_CTX *)xml,sig,(size_t)in_RCX._M_p,in_R8,in_R9)
  ;
  (local_38->path).filename._M_dataplus._M_p = this_01._M_p;
  (**(code **)(*(long *)this_01._M_p + 0x10))(this_01._M_p);
  (**(code **)(*(long *)this_01._M_p + 0x18))(this_01._M_p);
  if ((long *)local_50._16_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_50._16_8_ + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)local_38;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadSubdivMesh(const Ref<XML>& xml) 
  {
    Ref<SceneGraph::MaterialNode> material = loadMaterial(xml->child("material"));
    Ref<SceneGraph::SubdivMeshNode> mesh = new SceneGraph::SubdivMeshNode(material,BBox1f(0,1),0);

    if (Ref<XML> animation = xml->childOpt("animated_positions")) {
      for (size_t i=0; i<animation->size(); i++)
        mesh->positions.push_back(loadVec3faArray(animation->child(i)));
    } else {
      mesh->positions.push_back(loadVec3faArray(xml->childOpt("positions")));
      if (xml->hasChild("positions2")) 
        mesh->positions.push_back(loadVec3faArray(xml->childOpt("positions2")));
    }

    if (Ref<XML> animation = xml->childOpt("animated_normals")) {
      for (size_t i=0; i<animation->size(); i++)
        mesh->normals.push_back(loadVec3faArray(animation->child(i)));
    }
    else if (Ref<XML> normalbuf = xml->childOpt("normals")) {
      auto vec = loadVec3faArray(normalbuf);
      if (vec.size())
        for (size_t i=0; i<mesh->numTimeSteps(); i++)
          mesh->normals.push_back(vec);
    }
    
    mesh->texcoords = loadVec2fArray(xml->childOpt("texcoords"));

    if (Ref<XML> child = xml->childOpt("position_indices")) {
      mesh->position_indices = loadUIntArray(child);
      mesh->position_subdiv_mode = parseSubdivMode(child);
    }
    if (Ref<XML> child = xml->childOpt("normal_indices")) {
      mesh->normal_indices   = loadUIntArray(child);
      mesh->normal_subdiv_mode = parseSubdivMode(child);
    }
    if (Ref<XML> child = xml->childOpt("texcoord_indices")) {
      mesh->texcoord_indices = loadUIntArray(child);
      mesh->texcoord_subdiv_mode = parseSubdivMode(child);
    }

    mesh->verticesPerFace  = loadUIntArray(xml->childOpt("faces"));
    mesh->holes            = loadUIntArray(xml->childOpt("holes"));
    mesh->edge_creases     = loadVec2iArray(xml->childOpt("edge_creases"));
    mesh->edge_crease_weights = loadFloatArray(xml->childOpt("edge_crease_weights"));
    mesh->vertex_creases      = loadUIntArray(xml->childOpt("vertex_creases"));
    mesh->vertex_crease_weights = loadFloatArray(xml->childOpt("vertex_crease_weights"));
    mesh->verify();
    return mesh.dynamicCast<SceneGraph::Node>();
  }